

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O3

void __thiscall
draco::AttributeQuantizationTransform::CopyToAttributeTransformData
          (AttributeQuantizationTransform *this,AttributeTransformData *out_data)

{
  pointer pfVar1;
  ulong uVar2;
  long lVar3;
  
  out_data->transform_type_ = ATTRIBUTE_QUANTIZATION_TRANSFORM;
  AttributeTransformData::AppendParameterValue<int>(out_data,&this->quantization_bits_);
  pfVar1 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      AttributeTransformData::AppendParameterValue<float>(out_data,(float *)((long)pfVar1 + lVar3));
      uVar2 = uVar2 + 1;
      pfVar1 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 4;
    } while (uVar2 < (ulong)((long)(this->min_values_).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1 >> 2));
  }
  AttributeTransformData::AppendParameterValue<float>(out_data,&this->range_);
  return;
}

Assistant:

void AttributeQuantizationTransform::CopyToAttributeTransformData(
    AttributeTransformData *out_data) const {
  out_data->set_transform_type(ATTRIBUTE_QUANTIZATION_TRANSFORM);
  out_data->AppendParameterValue(quantization_bits_);
  for (int i = 0; i < min_values_.size(); ++i) {
    out_data->AppendParameterValue(min_values_[i]);
  }
  out_data->AppendParameterValue(range_);
}